

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall xmrig::Console::Console(Console *this,IConsoleListener *listener)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  undefined8 uVar4;
  Console *in_RSI;
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  *(Console **)(in_RDI + 8) = in_RSI;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  bVar1 = isSupported(in_RSI);
  if (bVar1) {
    pvVar3 = operator_new(0x138);
    *(void **)(in_RDI + 0x10) = pvVar3;
    **(undefined8 **)(in_RDI + 0x10) = in_RDI;
    uVar4 = uv_default_loop();
    uv_tty_init(uVar4,*(undefined8 *)(in_RDI + 0x10),0,1);
    iVar2 = uv_is_readable(*(undefined8 *)(in_RDI + 0x10));
    if (iVar2 != 0) {
      uv_tty_set_mode(*(undefined8 *)(in_RDI + 0x10),1);
      uv_read_start(*(undefined8 *)(in_RDI + 0x10),onAllocBuffer,onRead);
    }
  }
  return;
}

Assistant:

xmrig::Console::Console(IConsoleListener *listener)
    : m_listener(listener)
{
    if (!isSupported()) {
        return;
    }

    m_tty = new uv_tty_t;
    m_tty->data = this;
    uv_tty_init(uv_default_loop(), m_tty, 0, 1);

    if (!uv_is_readable(reinterpret_cast<uv_stream_t*>(m_tty))) {
        return;
    }

    uv_tty_set_mode(m_tty, UV_TTY_MODE_RAW);
    uv_read_start(reinterpret_cast<uv_stream_t*>(m_tty), Console::onAllocBuffer, Console::onRead);
}